

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::StringPtr,kj::StringPtr_const&,kj::StringPtr_const&,kj::StringPtr_const&>
                 (char *target,StringPtr *first,StringPtr *rest,StringPtr *rest_1,StringPtr *rest_2)

{
  char *pcVar1;
  StringPtr *first_00;
  StringPtr *rest_00;
  StringPtr *rest_1_00;
  char *end;
  char *i;
  StringPtr *rest_local_2;
  StringPtr *rest_local_1;
  StringPtr *rest_local;
  StringPtr *first_local;
  char *target_local;
  
  end = StringPtr::begin(first);
  pcVar1 = StringPtr::end(first);
  first_local = (StringPtr *)target;
  while (end != pcVar1) {
    *(char *)&(first_local->content).ptr = *end;
    end = end + 1;
    first_local = (StringPtr *)((long)&(first_local->content).ptr + 1);
  }
  first_00 = fwd<kj::StringPtr_const&>(rest);
  rest_00 = fwd<kj::StringPtr_const&>(rest_1);
  rest_1_00 = fwd<kj::StringPtr_const&>(rest_2);
  pcVar1 = fill<kj::StringPtr,kj::StringPtr_const&,kj::StringPtr_const&>
                     ((char *)first_local,first_00,rest_00,rest_1_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}